

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall
Diligent::GLContextState::SetPipeline(GLContextState *this,GLPipelineObj *GLPipeline)

{
  bool bVar1;
  Char *pCVar2;
  undefined1 local_70 [8];
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  GLenum err;
  GLuint GLPipelineHandle;
  GLPipelineObj *GLPipeline_local;
  GLContextState *this_local;
  
  msg.field_2._12_4_ = 0;
  bVar1 = UpdateBoundObject<GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>>
                    (&this->m_GLPipelineId,GLPipeline,(GLuint *)(msg.field_2._M_local_buf + 0xc));
  if (bVar1) {
    if (((this->m_Caps).IsProgramPipelineSupported & 1U) == 0) {
      FormatString<char[29]>((string *)local_70,(char (*) [29])"SetPipeline is not supported");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"SetPipeline",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xa5);
      std::__cxx11::string::~string((string *)local_70);
    }
    else {
      (*__glewBindProgramPipeline)(msg.field_2._12_4_);
      msg.field_2._8_4_ = glGetError();
      if (msg.field_2._8_4_ != 0) {
        LogError<false,char[32],char[17],unsigned_int>
                  (false,"SetPipeline",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0xa1,(char (*) [32])"Failed to bind program pipeline",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 8));
        FormatString<char[6]>((string *)local_40,(char (*) [6])0xe8e72e);
        pCVar2 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar2,"SetPipeline",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0xa1);
        std::__cxx11::string::~string((string *)local_40);
      }
    }
  }
  return;
}

Assistant:

void GLContextState::SetPipeline(const GLPipelineObj& GLPipeline)
{
    GLuint GLPipelineHandle = 0;
    if (UpdateBoundObject(m_GLPipelineId, GLPipeline, GLPipelineHandle))
    {
        if (m_Caps.IsProgramPipelineSupported)
        {
            glBindProgramPipeline(GLPipelineHandle);
            DEV_CHECK_GL_ERROR("Failed to bind program pipeline");
        }
        else
        {
            UNSUPPORTED("SetPipeline is not supported");
        }
    }
}